

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O1

void __thiscall ExecutionEngine::i_lload(ExecutionEngine *this)

{
  u2 uVar1;
  VMStack *this_00;
  Frame *this_01;
  u1 *puVar2;
  ushort uVar3;
  Value operand;
  Value operand_00;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  puVar2 = Frame::getCode(this_01,this_01->pc);
  uVar3 = (ushort)puVar2[1];
  if (this->_isWide == true) {
    uVar3 = CONCAT11(puVar2[1],puVar2[2]);
    this_01->pc = this_01->pc + 3;
    this->_isWide = false;
  }
  else {
    this_01->pc = this_01->pc + 2;
  }
  uVar1 = Frame::sizeLocalVariables(this_01);
  if ((int)((int)(short)uVar3 + 1U) < (int)(short)uVar1) {
    operand_00 = Frame::getLocalVariableValue(this_01,(int)(short)uVar3);
    operand.data = operand_00.data;
    if (operand_00.type == LONG) {
      operand.printType = BOOLEAN;
      operand.type = PADDING;
      Frame::pushIntoOperandStack(this_01,operand);
      Frame::pushIntoOperandStack(this_01,operand_00);
      return;
    }
    __assert_fail("value.type == ValueType::LONG",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x22b,"void ExecutionEngine::i_lload()");
  }
  __assert_fail("((int16_t)(topFrame->sizeLocalVariables()) > (index + 1))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x228,"void ExecutionEngine::i_lload()");
}

Assistant:

void ExecutionEngine::i_lload() {
	VMStack &stackFrame = VMStack::getInstance();
	Frame *topFrame = stackFrame.getTopFrame();

	u1 *code = topFrame->getCode(topFrame->pc);
	u1 byte1 = code[1]; //índice do vetor de variáveis locais
	int16_t index = (int16_t)byte1;

	if (_isWide) {
		u1 byte2 = code[2];
		index = (byte1 << 8) | byte2;
		topFrame->pc += 3;
		_isWide = false;
	}
	else {
		topFrame->pc += 2;
	}

	assert(((int16_t)(topFrame->sizeLocalVariables()) > (index + 1)));

	Value value = topFrame->getLocalVariableValue(index);
	assert(value.type == ValueType::LONG);

	Value padding;
	padding.type = ValueType::PADDING;

	topFrame->pushIntoOperandStack(padding);
	topFrame->pushIntoOperandStack(value);
}